

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void ReadArrayVars(PNGHandle *png,FWorldGlobalArray *vars,size_t count,DWORD id)

{
  uint uVar1;
  FILE *file;
  DWORD local_354;
  DWORD local_350;
  SDWORD val;
  SDWORD key;
  undefined1 local_340 [8];
  FPNGChunkArchive arc;
  DWORD size;
  DWORD max;
  uint k;
  uint i;
  size_t len;
  DWORD id_local;
  size_t count_local;
  FWorldGlobalArray *vars_local;
  PNGHandle *png_local;
  
  uVar1 = M_FindPNGChunk(png,id);
  for (max = 0; max < count; max = max + 1) {
    TMap<int,_int,_THashTraits<int>,_InitIntToZero>::Clear(vars + max,1);
  }
  if ((ulong)uVar1 != 0) {
    file = FileReader::GetFile(png->File);
    FPNGChunkArchive::FPNGChunkArchive((FPNGChunkArchive *)local_340,file,id,(ulong)uVar1);
    max = FArchive::ReadCount((FArchive *)local_340);
    arc.Chunk._52_4_ = FArchive::ReadCount((FArchive *)local_340);
    for (; max <= (uint)arc.Chunk._52_4_; max = max + 1) {
      arc.Chunk.m_ChunkID = FArchive::ReadCount((FArchive *)local_340);
      for (size = 0; size < arc.Chunk.m_ChunkID; size = size + 1) {
        local_350 = FArchive::ReadCount((FArchive *)local_340);
        local_354 = FArchive::ReadCount((FArchive *)local_340);
        TMap<int,_int,_THashTraits<int>,_InitIntToZero>::Insert
                  (vars + max,local_350,(int *)&local_354);
      }
    }
    FileReader::ResetFilePtr(png->File);
    FPNGChunkArchive::~FPNGChunkArchive((FPNGChunkArchive *)local_340);
  }
  return;
}

Assistant:

static void ReadArrayVars (PNGHandle *png, FWorldGlobalArray *vars, size_t count, DWORD id)
{
	size_t len = M_FindPNGChunk (png, id);
	unsigned int i, k;

	for (i = 0; i < count; ++i)
	{
		vars[i].Clear ();
	}

	if (len != 0)
	{
		DWORD max, size;
		FPNGChunkArchive arc (png->File->GetFile(), id, len);

		i = arc.ReadCount ();
		max = arc.ReadCount ();

		for (; i <= max; ++i)
		{
			size = arc.ReadCount ();
			for (k = 0; k < size; ++k)
			{
				SDWORD key, val;
				key = arc.ReadCount();

				val = arc.ReadCount();
				vars[i].Insert (key, val);
			}
		}
		png->File->ResetFilePtr();
	}
}